

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O1

void highwayhash::CountingSort<unsigned_int>(uint *begin,uint *end)

{
  int iVar1;
  uint uVar2;
  pair<unsigned_int,_int> *ppVar3;
  pair<unsigned_int,_int> *ppVar4;
  __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  _Var5;
  ulong uVar6;
  pair<unsigned_int,_int> *value_count;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *__range2;
  long lVar7;
  uint *puVar8;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> unique;
  pair<unsigned_int,_int> *local_48;
  pair<unsigned_int,_int> *ppStack_40;
  long local_38;
  pair<unsigned_int,_int> local_30;
  
  local_48 = (pair<unsigned_int,_int> *)0x0;
  ppStack_40 = (pair<unsigned_int,_int> *)0x0;
  local_38 = 0;
  if (begin != end) {
    puVar8 = begin;
    do {
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,__gnu_cxx::__ops::_Iter_pred<highwayhash::CountingSort<unsigned_int>(unsigned_int*,unsigned_int*)::_lambda(std::pair<unsigned_int,int>const&)_1_>>
                        (local_48,ppStack_40,*puVar8);
      if (_Var5._M_current == ppStack_40) {
        local_30 = (pair<unsigned_int,_int>)((ulong)*puVar8 | 0x100000000);
        std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
        emplace_back<std::pair<unsigned_int,int>>
                  ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>
                    *)&local_48,&local_30);
      }
      else {
        (_Var5._M_current)->second = (_Var5._M_current)->second + 1;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != end);
  }
  ppVar4 = ppStack_40;
  ppVar3 = local_48;
  if (local_48 != ppStack_40) {
    uVar6 = (long)ppStack_40 - (long)local_48 >> 3;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_48,ppStack_40,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar3,ppVar4);
    ppVar3 = local_48;
  }
  for (; ppVar3 != ppStack_40; ppVar3 = ppVar3 + 1) {
    iVar1 = ppVar3->second;
    if ((long)iVar1 != 0) {
      uVar2 = ppVar3->first;
      lVar7 = 0;
      do {
        *(uint *)((long)begin + lVar7) = uVar2;
        lVar7 = lVar7 + 4;
      } while ((long)iVar1 * 4 != lVar7);
    }
    begin = begin + ppVar3->second;
  }
  if (begin != end) {
    __assert_fail("p == end",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                  ,0x68,"void highwayhash::CountingSort(T *, T *) [T = unsigned int]");
  }
  if (local_48 != (pair<unsigned_int,_int> *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return;
}

Assistant:

void CountingSort(T* begin, T* end) {
  // Unique values and their frequency (similar to flat_map).
  using Unique = std::pair<T, int>;
  std::vector<Unique> unique;
  for (const T* p = begin; p != end; ++p) {
    const T value = *p;
    const auto pos =
        std::find_if(unique.begin(), unique.end(),
                     [value](const Unique& u) { return u.first == value; });
    if (pos == unique.end()) {
      unique.push_back(std::make_pair(*p, 1));
    } else {
      ++pos->second;
    }
  }

  // Sort in ascending order of value (pair.first).
  std::sort(unique.begin(), unique.end());

  // Write that many copies of each unique value to the array.
  T* HH_RESTRICT p = begin;
  for (const auto& value_count : unique) {
    std::fill(p, p + value_count.second, value_count.first);
    p += value_count.second;
  }
  assert(p == end);
}